

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O1

int main(int ArgC,char **ArgV)

{
  char *__filename;
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  uint uVar10;
  JL_STATUS JVar11;
  FILE *__stream;
  long lVar12;
  char *JsonString;
  size_t sVar13;
  int iVar14;
  long in_RSI;
  int in_EDI;
  bool bVar15;
  uint uVar16;
  char *pcVar17;
  JlDataObject *jsonObject;
  char *outputJsonString;
  size_t errorAtPos;
  JlDataObject *local_58;
  char *local_50;
  size_t local_48;
  int local_3c;
  char **local_38;
  
  local_3c = in_EDI;
  _Var1 = ParseCommandLineBoolArg(&local_3c,&local_38,"-a","--ascii");
  _Var2 = ParseCommandLineBoolArg(&local_3c,&local_38,"-i","--indent");
  _Var3 = ParseCommandLineBoolArg(&local_3c,&local_38,"-x","--hex");
  _Var4 = ParseCommandLineBoolArg(&local_3c,&local_38,"-c","--comma");
  _Var5 = ParseCommandLineBoolArg(&local_3c,&local_38,"-b","--bare");
  _Var6 = ParseCommandLineBoolArg(&local_3c,&local_38,"-s","--singlequote");
  _Var7 = ParseCommandLineBoolArg(&local_3c,&local_38,"-5","--json5");
  _Var8 = ParseCommandLineBoolArg(&local_3c,&local_38,"-h","--help");
  _Var9 = ParseCommandLineBoolArg(&local_3c,&local_38,"/h","/?");
  if (((local_3c != 2) || (_Var8)) || (_Var9)) {
    puts(
        "Syntax:\n  JsonRewrite [options] <JsonFile>\n   options:\n       -a, --ascii       - Escape all non ascii in output\n       -i, --indent      - Apply indent formatting to output\n       -x, --hex         - Allow hex in output (Json5)\n       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n       -c, --comma       - Put in trailing commas (Json5)\n       -5, --json5       - Combines --hex --bare --singlequote\n"
        );
    iVar14 = 1;
  }
  else {
    __filename = *(char **)(in_RSI + 8);
    JsonString = (char *)0x0;
    pcVar17 = (char *)0x2c;
    if (!_Var7) {
      pcVar17 = JsonString;
    }
    __stream = fopen(__filename,"rt");
    if (__stream == (FILE *)0x0) {
      bVar15 = false;
    }
    else {
      fseek(__stream,0,2);
      lVar12 = ftell(__stream);
      fseek(__stream,0,0);
      uVar16 = (uint)lVar12;
      if (((int)uVar16 < 1) ||
         (JsonString = (char *)malloc((ulong)(uVar16 + 1)), JsonString == (char *)0x0)) {
        JsonString = (char *)0x0;
        bVar15 = false;
      }
      else {
        sVar13 = fread(JsonString,1,(ulong)(uVar16 & 0x7fffffff),__stream);
        uVar10 = (uint)sVar13;
        bVar15 = 0 < (int)uVar10 && (int)uVar10 <= (int)uVar16;
        if (0 < (int)uVar10 && (int)uVar10 <= (int)uVar16) {
          JsonString[uVar10 & 0x7fffffff] = '\0';
          bVar15 = true;
        }
        else {
          JsonString = (char *)0x0;
        }
      }
      fclose(__stream);
    }
    if (bVar15) {
      local_48 = 0;
      local_58 = (JlDataObject *)0x0;
      JVar11 = JlParseJson(JsonString,&local_58,&local_48);
      if (JVar11 == JL_STATUS_SUCCESS) {
        local_50 = (char *)0x0;
        JVar11 = JlOutputJsonEx(local_58,((ulong)_Var4 << 4 |
                                         (ulong)_Var3 << 5 | (ulong)_Var1 + (ulong)_Var2 * 2) +
                                         (ulong)_Var5 * 4 + (ulong)_Var6 * 8 | (ulong)pcVar17,
                                &local_50);
        if (JVar11 == JL_STATUS_SUCCESS) {
          iVar14 = 0;
          printf("%s",local_50);
          JlFreeJsonStringBuffer(&local_50);
        }
        else {
          puts("Failed to output json");
          iVar14 = 4;
        }
        JlFreeObjectTree(&local_58);
      }
      else {
        printf("Failed to parse json in file: %s Position: %u\n",__filename,local_48 & 0xffffffff);
        iVar14 = 3;
      }
      free(JsonString);
    }
    else {
      printf("Failed to read file: %s\n",__filename);
      iVar14 = 2;
    }
  }
  return iVar14;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    bool outputAscii = ParseCommandLineBoolArg( &ArgC, &ArgV, "-a", "--ascii" );
    bool outputIndent = ParseCommandLineBoolArg( &ArgC, &ArgV, "-i", "--indent" );
    bool outputHex = ParseCommandLineBoolArg( &ArgC, &ArgV, "-x", "--hex" );
    bool outputComma = ParseCommandLineBoolArg( &ArgC, &ArgV, "-c", "--comma" );
    bool outputBare = ParseCommandLineBoolArg( &ArgC, &ArgV, "-b", "--bare" );
    bool outputSingleQuote = ParseCommandLineBoolArg( &ArgC, &ArgV, "-s", "--singlequote" );
    bool outputJson5 = ParseCommandLineBoolArg( &ArgC, &ArgV, "-5", "--json5" );
    bool help = ParseCommandLineBoolArg( &ArgC, &ArgV, "-h", "--help" );
    help |= ParseCommandLineBoolArg( &ArgC, &ArgV, "/h", "/?" );

    if( 2 != ArgC || help )
    {
        printf(
            "Syntax:\n"
            "  JsonRewrite [options] <JsonFile>\n"
            "   options:\n"
            "       -a, --ascii       - Escape all non ascii in output\n"
            "       -i, --indent      - Apply indent formatting to output\n"
            "       -x, --hex         - Allow hex in output (Json5)\n"
            "       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n"
            "       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n"
            "       -c, --comma       - Put in trailing commas (Json5)\n"
            "       -5, --json5       - Combines --hex --bare --singlequote\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;

        // Create output option flags.
        JL_OUTPUT_FLAGS outputFlags =
                ( outputAscii ? JL_OUTPUT_FLAGS_ASCII : 0 )
            |   ( outputIndent ? JL_OUTPUT_FLAGS_INDENT : 0 )
            |   ( outputHex ? JL_OUTPUT_FLAGS_J5_ALLOW_HEX : 0 )
            |   ( outputComma ? JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS : 0 )
            |   ( outputBare ? JL_OUTPUT_FLAGS_J5_USE_BARE_KEYWORDS : 0 )
            |   ( outputSingleQuote ? JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES : 0 )
            |   ( outputJson5 ? JL_OUTPUT_FLAGS_JSON5 : 0 );

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {
            JL_STATUS jlStatus;
            size_t errorAtPos = 0;
            JlDataObject* jsonObject = NULL;

            jlStatus = JlParseJson( inputJsonString, &jsonObject, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                char* outputJsonString = NULL;
                jlStatus = JlOutputJsonEx( jsonObject, outputFlags, &outputJsonString );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Print out the new formatted Json.
                    printf( "%s", outputJsonString );

                    JlFreeJsonStringBuffer( &outputJsonString );
                }
                else
                {
                    printf( "Failed to output json\n" );
                    result = 4;
                }

                JlFreeObjectTree( &jsonObject );
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
            }

            free( inputJsonString );
        }
        else
        {
            printf( "Failed to read file: %s\n", inputFilename );
            result = 2;
        }

    }

    return result;
}